

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RootPageMoved(sqlite3 *db,int iDb,int iFrom,int iTo)

{
  long lVar1;
  undefined8 *puVar2;
  
  lVar1 = *(long *)(db->aLimit + (long)iDb * 8 + -0x16);
  for (puVar2 = *(undefined8 **)(lVar1 + 0x10); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    if (*(int *)(puVar2[2] + 0x38) == iFrom) {
      *(int *)(puVar2[2] + 0x38) = iTo;
    }
  }
  for (puVar2 = *(undefined8 **)(lVar1 + 0x28); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    if (*(int *)(puVar2[2] + 0x58) == iFrom) {
      *(int *)(puVar2[2] + 0x58) = iTo;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RootPageMoved(sqlite3 *db, int iDb, int iFrom, int iTo){
  HashElem *pElem;
  Hash *pHash;
  Db *pDb;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pDb = &db->aDb[iDb];
  pHash = &pDb->pSchema->tblHash;
  for(pElem=sqliteHashFirst(pHash); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    if( pTab->tnum==iFrom ){
      pTab->tnum = iTo;
    }
  }
  pHash = &pDb->pSchema->idxHash;
  for(pElem=sqliteHashFirst(pHash); pElem; pElem=sqliteHashNext(pElem)){
    Index *pIdx = sqliteHashData(pElem);
    if( pIdx->tnum==iFrom ){
      pIdx->tnum = iTo;
    }
  }
}